

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_utf8.c
# Opt level: O2

void t29(void)

{
  uint in_EAX;
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  int pos;
  undefined8 uStack_18;
  
  uStack_18._0_4_ = in_EAX;
  uVar3 = al_ustr_new(anon_var_dwarf_b2e);
  uStack_18 = (ulong)(uint)uStack_18;
  iVar1 = al_ustr_get_next(uVar3);
  if (iVar1 == 0x61) {
    log_printf("OK   %s\n","al_ustr_get_next(us, &pos) == \'a\'");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_get_next(us, &pos) == \'a\'");
    error = error + 1;
  }
  iVar1 = al_ustr_get_next(uVar3,(long)&uStack_18 + 4);
  if (iVar1 == 0xfe) {
    log_printf("OK   %s\n","al_ustr_get_next(us, &pos) == U_thorn");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_get_next(us, &pos) == U_thorn");
    error = error + 1;
  }
  iVar1 = al_ustr_get_next(uVar3,(long)&uStack_18 + 4);
  if (iVar1 == 0x20ac) {
    log_printf("OK   %s\n","al_ustr_get_next(us, &pos) == U_euro");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_get_next(us, &pos) == U_euro");
    error = error + 1;
  }
  iVar1 = al_ustr_get_next(uVar3,(long)&uStack_18 + 4);
  if (iVar1 == -1) {
    log_printf("OK   %s\n","al_ustr_get_next(us, &pos) == -1");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_get_next(us, &pos) == -1");
    error = error + 1;
  }
  iVar1 = uStack_18._4_4_;
  iVar2 = al_ustr_size(uVar3);
  if (iVar1 == iVar2) {
    log_printf("OK   %s\n","pos == (int) al_ustr_size(us)");
  }
  else {
    log_printf("FAIL %s\n","pos == (int) al_ustr_size(us)");
    error = error + 1;
  }
  uStack_18 = CONCAT44(2,(uint)uStack_18);
  iVar1 = al_ustr_get_next(uVar3);
  if (iVar1 == -2) {
    log_printf("OK   %s\n","al_ustr_get_next(us, &pos) == -2");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_get_next(us, &pos) == -2");
    error = error + 1;
  }
  iVar1 = al_ustr_get_next(uVar3,(long)&uStack_18 + 4);
  if (iVar1 == 0x20ac) {
    log_printf("OK   %s\n","al_ustr_get_next(us, &pos) == U_euro");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_get_next(us, &pos) == U_euro");
    error = error + 1;
  }
  al_ustr_free(uVar3);
  return;
}

Assistant:

static void t29(void)
{
   ALLEGRO_USTR *us = al_ustr_new("aþ€");
   int pos;

   pos = 0;
   CHECK(al_ustr_get_next(us, &pos) == 'a');
   CHECK(al_ustr_get_next(us, &pos) == U_thorn);
   CHECK(al_ustr_get_next(us, &pos) == U_euro);
   CHECK(al_ustr_get_next(us, &pos) == -1);
   CHECK(pos == (int) al_ustr_size(us));

   /* Start in the middle of þ. */
   pos = 2;
   CHECK(al_ustr_get_next(us, &pos) == -2);
   CHECK(al_ustr_get_next(us, &pos) == U_euro);

   al_ustr_free(us);
}